

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<Range,_axl::sl::ArrayDetails<Range>_>::reserve
          (Array<Range,_axl::sl::ArrayDetails<Range>_> *this,size_t count)

{
  size_t sVar1;
  Hdr *pHVar2;
  Hdr *pHVar3;
  Hdr *this_00;
  Hdr *dst;
  long in_RSI;
  undefined8 *in_RDI;
  Range *p;
  Ptr<axl::sl::ArrayDetails<Range>::Hdr> hdr;
  size_t bufferSize;
  size_t size;
  Hdr *in_stack_ffffffffffffff78;
  Hdr *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Ptr local_38 [16];
  size_t local_28;
  ulong local_20;
  byte local_1;
  
  local_20 = in_RSI << 4;
  if (in_RDI[1] != 0) {
    sVar1 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]);
    if ((sVar1 == 1) && (local_20 <= *(ulong *)(in_RDI[1] + 0x18))) {
      local_1 = 1;
      goto LAB_0011f138;
    }
  }
  local_28 = getAllocSize(0x11efcf);
  pHVar2 = (Hdr *)mem::allocate(0x11efe2);
  ArrayDetails<Range>::Hdr::Hdr
            (pHVar2,in_stack_ffffffffffffff88,(uintptr_t)in_stack_ffffffffffffff80);
  rc::primeRefCount<axl::sl::ArrayDetails<testBoyerMoore()::Range>::Hdr>
            (in_stack_ffffffffffffff80,(FreeFunc *)in_stack_ffffffffffffff78);
  rc::Ptr<axl::sl::ArrayDetails<testBoyerMoore()::Range>::Hdr>::
  Ptr<axl::sl::ArrayDetails<testBoyerMoore()::Range>::Hdr>
            ((Ptr<axl::sl::ArrayDetails<Range>::Hdr> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  pHVar3 = rc::Ptr::operator_cast_to_Hdr_(local_38);
  if (pHVar3 == (Hdr *)0x0) {
    local_1 = 0;
  }
  else {
    pHVar3 = rc::Ptr::operator_cast_to_Hdr_(local_38);
    ArrayDetails<Range>::setHdrCount(pHVar3,in_RDI[2]);
    this_00 = rc::Ptr::operator_cast_to_Hdr_(local_38);
    dst = this_00 + 1;
    if (in_RDI[2] != 0) {
      ArrayDetails<Range>::constructCopy((Range *)dst,(Range *)*in_RDI,in_RDI[2]);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release((RefCount *)this_00);
    }
    *in_RDI = dst;
    pHVar2 = rc::Ptr<axl::sl::ArrayDetails<Range>::Hdr>::detach
                       ((Ptr<axl::sl::ArrayDetails<Range>::Hdr> *)pHVar2,(RefCount **)pHVar3);
    in_RDI[1] = pHVar2;
    local_1 = 1;
  }
  rc::Ptr<axl::sl::ArrayDetails<Range>::Hdr>::~Ptr
            ((Ptr<axl::sl::ArrayDetails<Range>::Hdr> *)0x11f138);
LAB_0011f138:
  return (bool)(local_1 & 1);
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}